

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

type __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::doCreateByKey<std::__cxx11::string,int>
          (Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  pointer pcVar6;
  size_t __n;
  undefined8 uVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  type piVar12;
  string *this_00;
  ulong insertion_idx;
  uint uVar13;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  do {
    sVar9 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                          *)this,key);
    uVar13 = ((uint)sVar9 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar5 = *(int *)(this + 0x28);
    insertion_idx = sVar9 >> 5 & *(ulong *)(this + 0x18);
    lVar11 = *(long *)(this + 8);
    bVar4 = *(byte *)(lVar11 + insertion_idx);
    while( true ) {
      uVar13 = uVar13 + iVar5;
      if (bVar4 <= uVar13) break;
      bVar4 = *(byte *)(lVar11 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
    }
    if (uVar13 == bVar4) {
      pcVar6 = (key->_M_dataplus)._M_p;
      __n = key->_M_string_length;
      piVar12 = (type)(*(long *)this + insertion_idx * 0x28 + 0x20);
      do {
        if (__n == *(size_t *)(piVar12 + -6)) {
          if (__n == 0) {
            return piVar12;
          }
          iVar8 = bcmp(pcVar6,*(void **)(piVar12 + -8),__n);
          if (iVar8 == 0) {
            return piVar12;
          }
        }
        uVar13 = uVar13 + iVar5;
        pbVar3 = (byte *)(lVar11 + 1 + insertion_idx);
        insertion_idx = insertion_idx + 1;
        piVar12 = piVar12 + 10;
      } while (uVar13 == *pbVar3);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
      if (0xff < iVar5 + uVar13) {
        *(undefined8 *)(this + 0x20) = 0;
      }
      lVar10 = 1;
      do {
        lVar10 = lVar10 + -1;
        pcVar2 = (char *)(lVar11 + insertion_idx);
        lVar11 = lVar11 + 1;
      } while (*pcVar2 != '\0');
      this_00 = (string *)(insertion_idx * 0x28 + *(long *)this);
      if (lVar10 == 0) {
        *(string **)this_00 = this_00 + 0x10;
        pcVar6 = (key->_M_dataplus)._M_p;
        paVar1 = &key->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 == paVar1) {
          uVar7 = *(undefined8 *)((long)&key->field_2 + 8);
          *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
          *(undefined8 *)(this_00 + 0x18) = uVar7;
        }
        else {
          *(pointer *)this_00 = pcVar6;
          *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
        }
        *(size_type *)(this_00 + 8) = key->_M_string_length;
        (key->_M_dataplus)._M_p = (pointer)paVar1;
        key->_M_string_length = 0;
        (key->field_2)._M_local_buf[0] = '\0';
        *(undefined4 *)(this_00 + 0x20) = 0;
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,insertion_idx - lVar10,insertion_idx);
        local_58 = (size_type *)(key->_M_dataplus)._M_p;
        paVar1 = &key->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58 == paVar1) {
          local_48 = paVar1->_M_allocated_capacity;
          uStack_40 = *(undefined8 *)((long)&key->field_2 + 8);
          local_58 = &local_48;
        }
        else {
          local_48 = paVar1->_M_allocated_capacity;
        }
        local_50 = key->_M_string_length;
        (key->_M_dataplus)._M_p = (pointer)paVar1;
        key->_M_string_length = 0;
        (key->field_2)._M_local_buf[0] = '\0';
        local_38 = 0;
        std::__cxx11::string::operator=(this_00,(string *)&local_58);
        *(undefined4 *)(this_00 + 0x20) = local_38;
        if (local_58 != &local_48) {
          operator_delete(local_58,local_48 + 1);
        }
      }
      *(char *)(*(long *)(this + 8) + insertion_idx) = (char)uVar13;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      return (type)(*(long *)this + insertion_idx * 0x28 + 0x20);
    }
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
  } while( true );
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type doCreateByKey(Arg&& key) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match. Can't do a do-while here because when mInfo is
            // 0 we don't want to skip forward
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do not insert.
                    return mKeyVals[idx].getSecond();
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                // put at empty spot. This forwards all arguments into the node where the object
                // is constructed exactly where it is needed.
                ::new (static_cast<void*>(&l))
                    Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            }

            // mKeyVals[idx].getFirst() = std::move(key);
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return mKeyVals[insertion_idx].getSecond();
        }
    }